

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

void * stbi__tga_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri)

{
  uchar uVar1;
  byte bVar2;
  stbi_uc asVar3 [4];
  stbi_uc sVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  byte *pbVar8;
  stbi_uc *psVar9;
  stbi_uc *psVar10;
  byte *pbVar11;
  long lVar12;
  undefined7 uVar14;
  char *pcVar13;
  int iVar15;
  int iVar16;
  uchar *puVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  long *in_FS_OFFSET;
  bool bVar22;
  bool bVar23;
  uchar raw_data [4];
  stbi_uc local_7c [4];
  uint *local_78;
  uint local_70;
  undefined4 local_6c;
  uint local_68;
  uint local_64;
  uint local_60;
  undefined4 local_5c;
  undefined4 local_58;
  uint local_54;
  stbi_uc *local_50;
  undefined8 local_48;
  ulong local_40;
  uint local_34;
  
  pbVar11 = s->img_buffer;
  local_78 = (uint *)y;
  if (pbVar11 < s->img_buffer_end) {
LAB_0013f146:
    s->img_buffer = pbVar11 + 1;
    local_48 = CONCAT44(local_48._4_4_,(uint)*pbVar11);
    pbVar11 = pbVar11 + 1;
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      pbVar11 = s->img_buffer;
      goto LAB_0013f146;
    }
    local_48 = (ulong)local_48._4_4_ << 0x20;
    pbVar11 = (byte *)comp;
  }
  psVar9 = s->img_buffer;
  if (psVar9 < s->img_buffer_end) {
LAB_0013f182:
    pbVar11 = psVar9 + 1;
    s->img_buffer = pbVar11;
    local_5c = (undefined4)CONCAT71((int7)((ulong)psVar9 >> 8),*psVar9 != '\0');
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      psVar9 = s->img_buffer;
      goto LAB_0013f182;
    }
    local_5c = 0;
  }
  psVar9 = s->img_buffer;
  if (psVar9 < s->img_buffer_end) {
LAB_0013f1c1:
    pbVar11 = psVar9 + 1;
    s->img_buffer = pbVar11;
    local_60 = (uint)CONCAT71((int7)((ulong)psVar9 >> 8),*psVar9);
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      psVar9 = s->img_buffer;
      goto LAB_0013f1c1;
    }
    local_60 = 0;
  }
  local_70 = stbi__get16le(s);
  local_54 = stbi__get16le(s);
  pbVar8 = s->img_buffer;
  if (pbVar8 < s->img_buffer_end) {
LAB_0013f214:
    pbVar11 = pbVar8 + 1;
    s->img_buffer = pbVar11;
    uVar19 = (ulong)*pbVar8;
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      pbVar8 = s->img_buffer;
      goto LAB_0013f214;
    }
    uVar19 = 0;
  }
  stbi__get16le(s);
  stbi__get16le(s);
  local_68 = stbi__get16le(s);
  uVar5 = stbi__get16le(s);
  uVar20 = (ulong)uVar5;
  psVar9 = s->img_buffer;
  if (psVar9 < s->img_buffer_end) {
LAB_0013f273:
    pbVar11 = psVar9 + 1;
    s->img_buffer = pbVar11;
    local_64 = (uint)CONCAT71((int7)((ulong)psVar9 >> 8),*psVar9);
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      psVar9 = s->img_buffer;
      goto LAB_0013f273;
    }
    local_64 = 0;
  }
  pbVar8 = s->img_buffer;
  if (pbVar8 < s->img_buffer_end) {
LAB_0013f2ae:
    pbVar11 = pbVar8 + 1;
    s->img_buffer = pbVar11;
    bVar23 = (*pbVar8 & 0x20) == 0;
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      pbVar8 = s->img_buffer;
      goto LAB_0013f2ae;
    }
    bVar23 = true;
  }
  uVar7 = local_68;
  local_7c[0] = '\0';
  local_7c[1] = '\0';
  local_7c[2] = '\0';
  local_7c[3] = '\0';
  uVar14 = (undefined7)((ulong)pbVar11 >> 8);
  if ((char)local_5c == '\0') {
    local_6c = (undefined4)CONCAT71(uVar14,1);
    uVar18 = local_64 & 0xff;
    if ((local_64 & 0xff) < 0x10) {
      if ((local_64 & 0xff) != 8) {
        if (uVar18 == 0xf) goto LAB_0013f365;
        goto LAB_0013f3cd;
      }
LAB_0013f3c4:
      uVar18 = 1;
    }
    else if ((uVar18 == 0x20) || (uVar18 == 0x18)) {
      uVar18 = local_64 >> 3 & 0x1f;
    }
    else {
      if (uVar18 != 0x10) goto LAB_0013f3cd;
      uVar18 = (local_60 & 0xff) - 8;
      if ((byte)local_60 < 8) {
        uVar18 = local_60 & 0xff;
      }
      if (uVar18 != 3) goto LAB_0013f365;
      uVar18 = uVar18 == 3 ^ 3;
    }
LAB_0013f3c9:
    local_58 = 0;
  }
  else {
    local_6c = (undefined4)CONCAT71(uVar14,1);
    uVar18 = (uint)uVar19;
    if (uVar18 < 0x18) {
      if (uVar18 - 0xf < 2) {
LAB_0013f365:
        uVar18 = 3;
        local_58 = 1;
        local_6c = 0;
        goto LAB_0013f3d1;
      }
      if (uVar18 == 8) goto LAB_0013f3c4;
    }
    else if ((uVar18 == 0x18) || (uVar18 == 0x20)) {
      uVar18 = (uint)(uVar19 >> 3);
      goto LAB_0013f3c9;
    }
LAB_0013f3cd:
    local_58 = 0;
    uVar18 = 0;
  }
LAB_0013f3d1:
  if (uVar18 == 0) {
    lVar12 = *in_FS_OFFSET;
    pcVar13 = "bad format";
    goto LAB_0013f886;
  }
  *x = local_68;
  *local_78 = uVar5;
  if (comp != (int *)0x0) {
    *comp = uVar18;
  }
  iVar6 = stbi__mad3sizes_valid(local_68,uVar5,uVar18,0);
  if (iVar6 == 0) {
    lVar12 = *in_FS_OFFSET;
    pcVar13 = "too large";
    goto LAB_0013f886;
  }
  psVar9 = (stbi_uc *)stbi__malloc_mad3(uVar7,uVar5,uVar18,0);
  if (psVar9 == (uchar *)0x0) {
LAB_0013f873:
    lVar12 = *in_FS_OFFSET;
    pcVar13 = "outofmem";
    goto LAB_0013f886;
  }
  local_78 = (uint *)CONCAT44(local_78._4_4_,uVar18);
  bVar22 = (byte)local_60 < 8;
  local_34 = req_comp;
  stbi__skip(s,(int)local_48);
  uVar18 = local_54;
  local_40 = uVar20;
  if (((char)local_5c == '\0' && (char)local_58 == '\0') && bVar22) {
    if (uVar5 != 0) {
      iVar6 = (uint)local_78 * local_68;
      uVar7 = 0;
      do {
        uVar5 = uVar5 - 1;
        uVar18 = uVar7;
        if (bVar23) {
          uVar18 = uVar5;
        }
        stbi__getn(s,psVar9 + (int)(uVar18 * iVar6),iVar6);
        uVar7 = uVar7 + 1;
      } while (uVar5 != 0);
    }
    goto LAB_0013f7e2;
  }
  if ((char)local_5c == '\0') {
    local_50 = (stbi_uc *)0x0;
  }
  else {
    if (local_54 == 0) {
LAB_0013f851:
      free(psVar9);
      lVar12 = *in_FS_OFFSET;
      pcVar13 = "bad palette";
LAB_0013f886:
      *(char **)(lVar12 + -0x20) = pcVar13;
      return (void *)0x0;
    }
    stbi__skip(s,local_70);
    psVar10 = (stbi_uc *)stbi__malloc_mad2(uVar18,(uint)local_78,0);
    if (psVar10 == (stbi_uc *)0x0) {
      free(psVar9);
      goto LAB_0013f873;
    }
    local_50 = psVar10;
    if ((char)local_6c == '\0') {
      uVar19 = (ulong)local_78 & 0xffffffff;
      psVar10 = psVar10 + 2;
      do {
        uVar7 = stbi__get16le(s);
        psVar10[-2] = (stbi_uc)((ulong)((uVar7 >> 10 & 0x1f) * 0xff) * 0x8421085 >> 0x20);
        psVar10[-1] = (stbi_uc)((ulong)((uVar7 >> 5 & 0x1f) * 0xff) * 0x8421085 >> 0x20);
        *psVar10 = (stbi_uc)((ulong)((uVar7 & 0x1f) * 0xff) * 0x8421085 >> 0x20);
        psVar10 = psVar10 + uVar19;
        uVar18 = uVar18 - 1;
        uVar7 = local_68;
      } while (uVar18 != 0);
    }
    else {
      iVar6 = stbi__getn(s,psVar10,(uint)local_78 * uVar18);
      if (iVar6 == 0) {
        free(psVar9);
        psVar9 = psVar10;
        goto LAB_0013f851;
      }
    }
  }
  if (uVar5 * uVar7 != 0) {
    uVar20 = (ulong)((uint)local_78 + ((uint)local_78 == 0));
    local_48 = (ulong)(uVar5 * uVar7);
    uVar19 = 0;
    bVar2 = 0;
    local_70 = 0;
    iVar6 = 0;
    do {
      if ((byte)local_60 < 8) {
LAB_0013f5ea:
        bVar22 = false;
      }
      else {
        if (iVar6 == 0) {
          pbVar11 = s->img_buffer;
          if (pbVar11 < s->img_buffer_end) {
LAB_0013f5ce:
            s->img_buffer = pbVar11 + 1;
            local_70 = (uint)*pbVar11;
          }
          else {
            if (s->read_from_callbacks != 0) {
              stbi__refill_buffer(s);
              pbVar11 = s->img_buffer;
              goto LAB_0013f5ce;
            }
            local_70 = 0;
          }
          iVar6 = (local_70 & 0x7f) + 1;
          local_70 = local_70 >> 7;
          goto LAB_0013f5ea;
        }
        bVar22 = (bool)(bVar2 & local_70 != 0);
        local_70 = (uint)(local_70 != 0);
      }
      if (!bVar22) {
        if ((char)local_5c == '\0') {
          if ((char)local_6c == '\0') {
            uVar5 = stbi__get16le(s);
            asVar3 = local_7c;
            local_7c[1] = (char)((ulong)((uVar5 >> 5 & 0x1f) * 0xff) * 0x8421085 >> 0x20);
            local_7c[0] = (char)((ulong)((uVar5 >> 10 & 0x1f) * 0xff) * 0x8421085 >> 0x20);
            local_7c[3] = asVar3[3];
            local_7c[2] = (char)((ulong)((uVar5 & 0x1f) * 0xff) * 0x8421085 >> 0x20);
          }
          else {
            uVar21 = 0;
            do {
              psVar10 = s->img_buffer;
              if (psVar10 < s->img_buffer_end) {
LAB_0013f670:
                s->img_buffer = psVar10 + 1;
                sVar4 = *psVar10;
              }
              else {
                if (s->read_from_callbacks != 0) {
                  stbi__refill_buffer(s);
                  psVar10 = s->img_buffer;
                  goto LAB_0013f670;
                }
                sVar4 = '\0';
              }
              local_7c[uVar21] = sVar4;
              uVar21 = uVar21 + 1;
            } while (uVar20 != uVar21);
          }
        }
        else {
          if ((char)local_64 == '\b') {
            pbVar11 = s->img_buffer;
            if (s->img_buffer_end <= pbVar11) {
              if (s->read_from_callbacks == 0) {
                uVar5 = 0;
                goto LAB_0013f69d;
              }
              stbi__refill_buffer(s);
              pbVar11 = s->img_buffer;
            }
            s->img_buffer = pbVar11 + 1;
            uVar5 = (uint)*pbVar11;
          }
          else {
            uVar5 = stbi__get16le(s);
          }
LAB_0013f69d:
          if (local_54 <= uVar5) {
            uVar5 = 0;
          }
          memcpy(local_7c,local_50 + uVar5 * (uint)local_78,uVar20);
        }
      }
      memcpy(psVar9 + (uint)local_78 * (int)uVar19,local_7c,uVar20);
      iVar6 = iVar6 + -1;
      uVar19 = uVar19 + 1;
      bVar2 = 1;
      uVar5 = (uint)local_40;
    } while (uVar19 != local_48);
  }
  if (bVar23 && uVar5 != 0) {
    iVar6 = (uint)local_78 * local_68;
    iVar15 = iVar6 * (uVar5 - 1);
    uVar18 = 0;
    uVar7 = 0;
    do {
      if (local_68 != 0) {
        puVar17 = psVar9;
        iVar16 = iVar6 + 1;
        do {
          uVar1 = puVar17[uVar18];
          puVar17[uVar18] = puVar17[iVar15];
          puVar17[iVar15] = uVar1;
          puVar17 = puVar17 + 1;
          iVar16 = iVar16 + -1;
        } while (1 < iVar16);
      }
      iVar15 = iVar15 - iVar6;
      uVar18 = uVar18 + iVar6;
      bVar23 = uVar7 != uVar5 - 1 >> 1;
      uVar7 = uVar7 + 1;
    } while (bVar23);
  }
  if (local_50 != (stbi_uc *)0x0) {
    free(local_50);
  }
LAB_0013f7e2:
  if (((char)local_58 == '\0' && 2 < (uint)local_78) &&
     (iVar6 = (uint)local_40 * local_68, iVar6 != 0)) {
    puVar17 = psVar9 + 2;
    do {
      uVar1 = puVar17[-2];
      puVar17[-2] = *puVar17;
      *puVar17 = uVar1;
      puVar17 = puVar17 + ((ulong)local_78 & 0xffffffff);
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
  }
  if (local_34 == 0) {
    return psVar9;
  }
  if ((uint)local_78 == local_34) {
    return psVar9;
  }
  puVar17 = stbi__convert_format(psVar9,(uint)local_78,local_34,local_68,(uint)local_40);
  return puVar17;
}

Assistant:

static void *stbi__tga_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri)
{
   //   read in the TGA header stuff
   int tga_offset = stbi__get8(s);
   int tga_indexed = stbi__get8(s);
   int tga_image_type = stbi__get8(s);
   int tga_is_RLE = 0;
   int tga_palette_start = stbi__get16le(s);
   int tga_palette_len = stbi__get16le(s);
   int tga_palette_bits = stbi__get8(s);
   int tga_x_origin = stbi__get16le(s);
   int tga_y_origin = stbi__get16le(s);
   int tga_width = stbi__get16le(s);
   int tga_height = stbi__get16le(s);
   int tga_bits_per_pixel = stbi__get8(s);
   int tga_comp, tga_rgb16=0;
   int tga_inverted = stbi__get8(s);
   // int tga_alpha_bits = tga_inverted & 15; // the 4 lowest bits - unused (useless?)
   //   image data
   unsigned char *tga_data;
   unsigned char *tga_palette = NULL;
   int i, j;
   unsigned char raw_data[4] = {0};
   int RLE_count = 0;
   int RLE_repeating = 0;
   int read_next_pixel = 1;
   STBI_NOTUSED(ri);
   STBI_NOTUSED(tga_x_origin); // @TODO
   STBI_NOTUSED(tga_y_origin); // @TODO

   if (tga_height > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");
   if (tga_width > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");

   //   do a tiny bit of precessing
   if ( tga_image_type >= 8 )
   {
      tga_image_type -= 8;
      tga_is_RLE = 1;
   }
   tga_inverted = 1 - ((tga_inverted >> 5) & 1);

   //   If I'm paletted, then I'll use the number of bits from the palette
   if ( tga_indexed ) tga_comp = stbi__tga_get_comp(tga_palette_bits, 0, &tga_rgb16);
   else tga_comp = stbi__tga_get_comp(tga_bits_per_pixel, (tga_image_type == 3), &tga_rgb16);

   if(!tga_comp) // shouldn't really happen, stbi__tga_test() should have ensured basic consistency
      return stbi__errpuc("bad format", "Can't find out TGA pixelformat");

   //   tga info
   *x = tga_width;
   *y = tga_height;
   if (comp) *comp = tga_comp;

   if (!stbi__mad3sizes_valid(tga_width, tga_height, tga_comp, 0))
      return stbi__errpuc("too large", "Corrupt TGA");

   tga_data = (unsigned char*)stbi__malloc_mad3(tga_width, tga_height, tga_comp, 0);
   if (!tga_data) return stbi__errpuc("outofmem", "Out of memory");

   // skip to the data's starting position (offset usually = 0)
   stbi__skip(s, tga_offset );

   if ( !tga_indexed && !tga_is_RLE && !tga_rgb16 ) {
      for (i=0; i < tga_height; ++i) {
         int row = tga_inverted ? tga_height -i - 1 : i;
         stbi_uc *tga_row = tga_data + row*tga_width*tga_comp;
         stbi__getn(s, tga_row, tga_width * tga_comp);
      }
   } else  {
      //   do I need to load a palette?
      if ( tga_indexed)
      {
         if (tga_palette_len == 0) {  /* you have to have at least one entry! */
            STBI_FREE(tga_data);
            return stbi__errpuc("bad palette", "Corrupt TGA");
         }

         //   any data to skip? (offset usually = 0)
         stbi__skip(s, tga_palette_start );
         //   load the palette
         tga_palette = (unsigned char*)stbi__malloc_mad2(tga_palette_len, tga_comp, 0);
         if (!tga_palette) {
            STBI_FREE(tga_data);
            return stbi__errpuc("outofmem", "Out of memory");
         }
         if (tga_rgb16) {
            stbi_uc *pal_entry = tga_palette;
            STBI_ASSERT(tga_comp == STBI_rgb);
            for (i=0; i < tga_palette_len; ++i) {
               stbi__tga_read_rgb16(s, pal_entry);
               pal_entry += tga_comp;
            }
         } else if (!stbi__getn(s, tga_palette, tga_palette_len * tga_comp)) {
               STBI_FREE(tga_data);
               STBI_FREE(tga_palette);
               return stbi__errpuc("bad palette", "Corrupt TGA");
         }
      }
      //   load the data
      for (i=0; i < tga_width * tga_height; ++i)
      {
         //   if I'm in RLE mode, do I need to get a RLE stbi__pngchunk?
         if ( tga_is_RLE )
         {
            if ( RLE_count == 0 )
            {
               //   yep, get the next byte as a RLE command
               int RLE_cmd = stbi__get8(s);
               RLE_count = 1 + (RLE_cmd & 127);
               RLE_repeating = RLE_cmd >> 7;
               read_next_pixel = 1;
            } else if ( !RLE_repeating )
            {
               read_next_pixel = 1;
            }
         } else
         {
            read_next_pixel = 1;
         }
         //   OK, if I need to read a pixel, do it now
         if ( read_next_pixel )
         {
            //   load however much data we did have
            if ( tga_indexed )
            {
               // read in index, then perform the lookup
               int pal_idx = (tga_bits_per_pixel == 8) ? stbi__get8(s) : stbi__get16le(s);
               if ( pal_idx >= tga_palette_len ) {
                  // invalid index
                  pal_idx = 0;
               }
               pal_idx *= tga_comp;
               for (j = 0; j < tga_comp; ++j) {
                  raw_data[j] = tga_palette[pal_idx+j];
               }
            } else if(tga_rgb16) {
               STBI_ASSERT(tga_comp == STBI_rgb);
               stbi__tga_read_rgb16(s, raw_data);
            } else {
               //   read in the data raw
               for (j = 0; j < tga_comp; ++j) {
                  raw_data[j] = stbi__get8(s);
               }
            }
            //   clear the reading flag for the next pixel
            read_next_pixel = 0;
         } // end of reading a pixel

         // copy data
         for (j = 0; j < tga_comp; ++j)
           tga_data[i*tga_comp+j] = raw_data[j];

         //   in case we're in RLE mode, keep counting down
         --RLE_count;
      }
      //   do I need to invert the image?
      if ( tga_inverted )
      {
         for (j = 0; j*2 < tga_height; ++j)
         {
            int index1 = j * tga_width * tga_comp;
            int index2 = (tga_height - 1 - j) * tga_width * tga_comp;
            for (i = tga_width * tga_comp; i > 0; --i)
            {
               unsigned char temp = tga_data[index1];
               tga_data[index1] = tga_data[index2];
               tga_data[index2] = temp;
               ++index1;
               ++index2;
            }
         }
      }
      //   clear my palette, if I had one
      if ( tga_palette != NULL )
      {
         STBI_FREE( tga_palette );
      }
   }

   // swap RGB - if the source data was RGB16, it already is in the right order
   if (tga_comp >= 3 && !tga_rgb16)
   {
      unsigned char* tga_pixel = tga_data;
      for (i=0; i < tga_width * tga_height; ++i)
      {
         unsigned char temp = tga_pixel[0];
         tga_pixel[0] = tga_pixel[2];
         tga_pixel[2] = temp;
         tga_pixel += tga_comp;
      }
   }

   // convert to target component count
   if (req_comp && req_comp != tga_comp)
      tga_data = stbi__convert_format(tga_data, tga_comp, req_comp, tga_width, tga_height);

   //   the things I do to get rid of an error message, and yet keep
   //   Microsoft's C compilers happy... [8^(
   tga_palette_start = tga_palette_len = tga_palette_bits =
         tga_x_origin = tga_y_origin = 0;
   STBI_NOTUSED(tga_palette_start);
   //   OK, done
   return tga_data;
}